

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O2

VkExtent3D vkt::sr::mipLevelExtents(VkExtent3D *baseExtents,deUint32 mipLevel)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  VkExtent3D VVar4;
  
  bVar1 = (byte)mipLevel;
  uVar2 = baseExtents->width >> (bVar1 & 0x1f);
  VVar4.width = uVar2 + (uVar2 == 0);
  uVar3 = baseExtents->height >> (bVar1 & 0x1f);
  uVar2 = baseExtents->depth >> (bVar1 & 0x1f);
  VVar4.depth = uVar2 + (uVar2 == 0);
  VVar4.height = uVar3 + (uVar3 == 0);
  return VVar4;
}

Assistant:

VkExtent3D mipLevelExtents (const VkExtent3D& baseExtents, const deUint32 mipLevel)
{
	VkExtent3D result;

	result.width	= std::max(baseExtents.width  >> mipLevel, 1u);
	result.height	= std::max(baseExtents.height >> mipLevel, 1u);
	result.depth	= std::max(baseExtents.depth  >> mipLevel, 1u);

	return result;
}